

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14cf1db::QChildProcess::CharPointerList::updatePointers
          (CharPointerList *this,qsizetype count)

{
  char **ppcVar1;
  char *pcVar2;
  _Head_base<0UL,_char_**,_false> _Var3;
  long lVar4;
  
  if (0 < count) {
    pcVar2 = (this->data).d.ptr;
    lVar4 = 0;
    do {
      _Var3._M_head_impl =
           (this->pointers)._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
           super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
           super__Head_base<0UL,_char_**,_false>._M_head_impl;
      if (_Var3._M_head_impl == (char **)0x0) {
        _GLOBAL__N_1::QChildProcess::CharPointerList::updatePointers();
      }
      ppcVar1 = _Var3._M_head_impl + lVar4;
      *ppcVar1 = pcVar2 + (long)*ppcVar1;
      lVar4 = lVar4 + 1;
    } while (count != lVar4);
  }
  return;
}

Assistant:

void QChildProcess::CharPointerList::updatePointers(qsizetype count)
{
    char *const base = const_cast<char *>(data.constBegin());
    for (qsizetype i = 0; i < count; ++i)
        pointers[i] = base + qptrdiff(pointers[i]);
}